

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:550:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:550:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  long *plVar2;
  value *item;
  pointer e;
  anon_class_8_1_2a3436f3 add_object;
  object_ptr a;
  uint32_t n;
  anon_class_24_3_4e94b03e add_value;
  gc_heap_ptr_untyped local_80;
  anon_class_8_1_2a3436f3 local_70;
  gc_heap_ptr_untyped local_68;
  gc_heap_ptr_untyped local_58;
  uint32_t local_44;
  anon_class_24_3_4e94b03e local_40;
  
  local_80.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_80.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  if (local_80.heap_ == (gc_heap *)0x0) {
    local_40.h = (gc_heap *)0x0;
  }
  else {
    gc_heap::attach(local_80.heap_,&local_80);
    local_40.h = local_80.heap_;
  }
  make_array((gc_heap_ptr<mjs::global_object> *)&local_68,(uint32_t)&local_80);
  local_40.n = &local_44;
  local_44 = 0;
  local_70.add_value = &local_40;
  local_40.a = (object_ptr *)&local_68;
  plVar2 = (long *)gc_heap_ptr_untyped::get(&local_80);
  (**(code **)(*plVar2 + 0x88))(&local_58,plVar2,this_);
  anon_unknown_110::array_concat::anon_class_8_1_2a3436f3::operator()
            (&local_70,(object_ptr *)&local_58);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
  e = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (e != pvVar1) {
    do {
      if (e->type_ == object) {
        anon_unknown_110::array_concat::anon_class_8_1_2a3436f3::operator()
                  (&local_70,&(e->field_1).o_);
      }
      else {
        anon_unknown_110::array_concat::anon_class_24_3_4e94b03e::operator()(&local_40,e);
      }
      e = e + 1;
    } while (e != pvVar1);
  }
  __return_storage_ptr__->type_ = object;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_68.heap_;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_68.pos_;
  if (local_68.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_68.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }